

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O2

void * priority_queue_poll(priority_queue_t *queue)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  err_lvl_t lvl;
  void *pvVar5;
  long lStack_20;
  
  if (queue->size == 0) {
    fmt = "Trying to poll from empty queue\n";
    lvl = ERR_WARN;
    lStack_20 = 0x4c;
  }
  else {
    pvVar1 = queue->max_element;
    if (pvVar1 != (void *)0x0) {
      uVar3 = queue->alloc_size;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if (queue->pointers[uVar4] == pvVar1) {
          queue->pointers[uVar4] = (void *)0x0;
          break;
        }
      }
      queue->max_element = (void *)0x0;
      uVar4 = 0;
      do {
        if (uVar3 <= uVar4) {
          queue->size = queue->size - 1;
          return pvVar1;
        }
        pvVar5 = queue->pointers[uVar4];
        if (pvVar5 != (void *)0x0) {
          if (queue->max_element != (void *)0x0) {
            iVar2 = (*queue->compare)(pvVar5,queue->max_element);
            if (-1 < iVar2) goto LAB_00112d74;
            pvVar5 = queue->pointers[uVar4];
          }
          queue->max_element = pvVar5;
        }
LAB_00112d74:
        uVar4 = uVar4 + 1;
        uVar3 = queue->alloc_size;
      } while( true );
    }
    fmt = "Trying to poll from queue and max element is undefined\n";
    lvl = ERR_ERROR;
    lStack_20 = 0x50;
  }
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/priority_queue.c"
          ,lStack_20,fmt);
  return (void *)0x0;
}

Assistant:

void* priority_queue_poll(priority_queue_t *queue)
{
    
    size_t i;
    void *res;

    if (queue->size == 0) {
        E_WARN("Trying to poll from empty queue\n");
        return NULL;
    }
    if (queue->max_element == NULL) {
        E_ERROR("Trying to poll from queue and max element is undefined\n");
        return NULL;
    }
    res = queue->max_element;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == queue->max_element) {
            queue->pointers[i] = NULL;
            break;
        }
    }
    queue->max_element = NULL;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == 0)
            continue;
        if (queue->max_element == NULL) {
            queue->max_element = queue->pointers[i];
        } else {
            if (queue->compare(queue->pointers[i], queue->max_element) < 0)
                queue->max_element = queue->pointers[i];
        }
    }
    queue->size--;
    return res;
}